

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  bool bVar5;
  uint16_t uVar6;
  float fVar7;
  int x;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int32_t *piVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  float *pfVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  void *pvVar22;
  bool bVar23;
  
  pvVar22 = decode->unpacked_buffer;
  piVar13 = decode->sample_count_table;
  uVar2 = (decode->chunk).width;
  iVar8 = (decode->chunk).height - decode->user_line_end_ignore;
  uVar14 = 0;
  if (0 < (int)uVar2) {
    uVar14 = (ulong)uVar2;
  }
  iVar3 = decode->user_line_begin_skip;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  iVar17 = 0;
  lVar11 = 0;
  do {
    if (iVar17 == iVar8) {
      return 0;
    }
    uVar21 = 0;
    while( true ) {
      uVar9 = uVar21;
      if ((long)decode->channel_count <= (long)uVar9) break;
      bVar5 = iVar17 < iVar3;
      peVar4 = decode->channels;
      uVar21 = uVar9 + 1;
      bVar23 = uVar21 != (uint)(int)decode->channel_count;
      cVar1 = peVar4[uVar9].bytes_per_element;
      if (peVar4[uVar9].field_12.decode_to_ptr == (uint8_t *)0x0) {
        if ((decode->decode_flags & 1) == 0) {
          iVar16 = piVar13[(long)(int)uVar2 + -1];
        }
        else {
          iVar16 = 0;
          for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
            iVar16 = iVar16 + piVar13[uVar9];
          }
        }
        pvVar22 = (void *)((long)pvVar22 + (long)cVar1 * (long)iVar16);
        lVar19 = (long)iVar16;
        if (bVar23 || bVar5) {
          lVar19 = 0;
        }
        lVar11 = lVar11 + lVar19;
      }
      else {
        lVar19 = (long)peVar4[uVar9].user_bytes_per_element;
        pfVar18 = (float *)(peVar4[uVar9].field_12.decode_to_ptr + lVar11 * lVar19);
        iVar16 = 0;
        for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
          iVar20 = iVar16;
          iVar10 = piVar13[uVar15];
          if ((decode->decode_flags & 1) != 0) {
            iVar20 = 0;
            iVar10 = iVar16;
          }
          iVar16 = iVar10;
          iVar20 = piVar13[uVar15] - iVar20;
          uVar6 = peVar4[uVar9].data_type;
          if (uVar6 == 0) {
            uVar6 = peVar4[uVar9].user_data_type;
            if (uVar6 == 2) {
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                *pfVar18 = (float)*(uint *)((long)pvVar22 + lVar12 * 4);
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
            else if (uVar6 == 1) {
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                uVar6 = uint_to_half(*(uint32_t *)((long)pvVar22 + lVar12 * 4));
                *(uint16_t *)pfVar18 = uVar6;
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
            else {
              if (uVar6 != 0) {
                return 3;
              }
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                *pfVar18 = *(float *)((long)pvVar22 + lVar12 * 4);
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
          }
          else if (uVar6 == 2) {
            uVar6 = peVar4[uVar9].user_data_type;
            if (uVar6 == 2) {
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                *pfVar18 = *(float *)((long)pvVar22 + lVar12 * 4);
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
            else if (uVar6 == 1) {
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                uVar6 = float_to_half(*(float *)((long)pvVar22 + lVar12 * 4));
                *(uint16_t *)pfVar18 = uVar6;
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
            else {
              if (uVar6 != 0) {
                return 3;
              }
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                fVar7 = (float)float_to_uint_int(*(uint32_t *)((long)pvVar22 + lVar12 * 4));
                *pfVar18 = fVar7;
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
          }
          else {
            if (uVar6 != 1) {
              return 3;
            }
            uVar6 = peVar4[uVar9].user_data_type;
            if (uVar6 == 2) {
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                fVar7 = half_to_float(*(uint16_t *)((long)pvVar22 + lVar12 * 2));
                *pfVar18 = fVar7;
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
            else if (uVar6 == 1) {
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                *(uint16_t *)pfVar18 = *(uint16_t *)((long)pvVar22 + lVar12 * 2);
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
            else {
              if (uVar6 != 0) {
                return 3;
              }
              iVar10 = 0;
              if (0 < iVar20) {
                iVar10 = iVar20;
              }
              for (lVar12 = 0; iVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
                fVar7 = (float)half_to_uint(*(uint16_t *)((long)pvVar22 + lVar12 * 2));
                *pfVar18 = fVar7;
                pfVar18 = (float *)((long)pfVar18 + lVar19);
              }
            }
          }
          pvVar22 = (void *)((long)pvVar22 + (long)iVar20 * (long)cVar1);
          lVar12 = (long)iVar20;
          if (bVar23 || bVar5) {
            lVar12 = 0;
          }
          lVar11 = lVar11 + lVar12;
        }
      }
    }
    piVar13 = piVar13 + (int)uVar2;
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height - decode->user_line_end_ignore;

    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = (y >= uls && ((c + 1) == decode->channel_count));

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];

                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }

            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += ((size_t) bpc) * ((size_t) samps);
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}